

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteStandard<unsigned_long,short,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  short *psVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  optional_idx sel_vector;
  short sVar5;
  idx_t iVar6;
  Vector *vector;
  SelectionVector *sel;
  optional_idx dict_size;
  unsigned_long *local_70;
  ValidityMask local_68;
  
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar2 = (short *)result->data;
    puVar3 = (unsigned_long *)input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<unsigned_long,short,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
              (puVar3,psVar2,count,&input->validity,&result->validity,dataptr,adds_nulls);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      if ((((errors == CANNOT_ERROR) &&
           (dict_size = DictionaryVector::DictionarySize(input),
           dict_size.index != 0xffffffffffffffff)) &&
          (iVar6 = optional_idx::GetIndex(&dict_size), iVar6 * 2 <= count)) &&
         (vector = DictionaryVector::Child(input), vector->vector_type == FLAT_VECTOR)) {
        psVar2 = (short *)result->data;
        puVar3 = (unsigned_long *)vector->data;
        iVar6 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        ExecuteFlat<unsigned_long,short,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
                  (puVar3,psVar2,iVar6,&vector->validity,&result->validity,dataptr,adds_nulls);
        sel = DictionaryVector::SelVector(input);
        iVar6 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar6,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      psVar2 = (short *)result->data;
      puVar3 = (unsigned_long *)input->data;
      puVar4 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      sVar5 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_long,short>
                        (*puVar3,&result->validity,0,dataptr);
      *psVar2 = sVar5;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    sel_vector = dict_size;
    psVar2 = (short *)result->data;
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<unsigned_long,short,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
              (local_70,psVar2,count,(SelectionVector *)sel_vector.index,&local_68,&result->validity
               ,dataptr,adds_nulls);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}